

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_5::TwoLevelIterator::status(TwoLevelIterator *this)

{
  bool bVar1;
  Iterator *pIVar2;
  long in_RSI;
  byte local_49;
  undefined1 local_28 [24];
  TwoLevelIterator *this_local;
  
  this_local = this;
  IteratorWrapper::status((IteratorWrapper *)(local_28 + 8));
  bVar1 = Status::ok((Status *)(local_28 + 8));
  Status::~Status((Status *)(local_28 + 8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pIVar2 = IteratorWrapper::iter((IteratorWrapper *)(in_RSI + 0x70));
    local_49 = 0;
    if (pIVar2 != (Iterator *)0x0) {
      IteratorWrapper::status((IteratorWrapper *)local_28);
      bVar1 = Status::ok((Status *)local_28);
      local_49 = bVar1 ^ 0xff;
      Status::~Status((Status *)local_28);
    }
    if ((local_49 & 1) == 0) {
      Status::Status((Status *)this,(Status *)(in_RSI + 0x48));
    }
    else {
      IteratorWrapper::status((IteratorWrapper *)this);
    }
  }
  else {
    IteratorWrapper::status((IteratorWrapper *)this);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status status() const {
                // It'd be nice if status() returned a const Status& instead of a Status
                if (!index_iter_.status().ok()) {
                    return index_iter_.status();
                } else if (data_iter_.iter() != NULL && !data_iter_.status().ok()) {
                    return data_iter_.status();
                } else {
                    return status_;
                }
            }